

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O1

uint32 __thiscall
TTD::UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Count
          (UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL> *this)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (long)(this->m_inlineHeadBlock).CurrPos - (long)(this->m_inlineHeadBlock).BlockData;
  if (uVar1 < 0xe70) {
    uVar1 = uVar1 / 0x70;
    while( true ) {
      this = (UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL> *)
             (this->m_inlineHeadBlock).Next;
      if (this == (UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL> *)0x0) {
        return (uint32)uVar1;
      }
      uVar2 = (long)(this->m_inlineHeadBlock).CurrPos - (long)(this->m_inlineHeadBlock).BlockData;
      if (0xe6f < uVar2) break;
      uVar1 = uVar1 + uVar2 / 0x70;
    }
  }
  TTDAbort_unrecoverable_error("We somehow wrote in too much data.");
}

Assistant:

uint32 Count() const
        {
            size_t count = (((byte*)this->m_inlineHeadBlock.CurrPos) - ((byte*)this->m_inlineHeadBlock.BlockData)) / sizeof(T);
            TTDAssert(count <= allocSize, "We somehow wrote in too much data.");

            for (UnorderedArrayListLink* curr = this->m_inlineHeadBlock.Next; curr != nullptr; curr = curr->Next)
            {
                size_t ncount = (((byte*)curr->CurrPos) - ((byte*)curr->BlockData)) / sizeof(T);
                TTDAssert(ncount <= allocSize, "We somehow wrote in too much data.");

                count += ncount;
            }

            return (uint32)count;
        }